

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

uint8 get8(vorb *z)

{
  uint8 *puVar1;
  int iVar2;
  long in_RDI;
  int c;
  uint8 local_1;
  
  if (*(long *)(in_RDI + 0x40) == 0) {
    iVar2 = fgetc(*(FILE **)(in_RDI + 0x30));
    if (iVar2 == -1) {
      *(undefined4 *)(in_RDI + 0x98) = 1;
      local_1 = '\0';
    }
    else {
      local_1 = (uint8)iVar2;
    }
  }
  else if (*(ulong *)(in_RDI + 0x40) < *(ulong *)(in_RDI + 0x50)) {
    puVar1 = *(uint8 **)(in_RDI + 0x40);
    *(uint8 **)(in_RDI + 0x40) = puVar1 + 1;
    local_1 = *puVar1;
  }
  else {
    *(undefined4 *)(in_RDI + 0x98) = 1;
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

static uint8 get8(vorb *z)
{
   if (USE_MEMORY(z)) {
      if (z->stream >= z->stream_end) { z->eof = TRUE; return 0; }
      return *z->stream++;
   }

   #ifndef STB_VORBIS_NO_STDIO
   {
   int c = fgetc(z->f);
   if (c == EOF) { z->eof = TRUE; return 0; }
   return c;
   }
   #endif
}